

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O0

void __thiscall
avro::parsing::SimpleParser<avro::parsing::ResolvingDecoderHandler>::setRepeatCount
          (SimpleParser<avro::parsing::ResolvingDecoderHandler> *this,size_t n)

{
  reference this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  string *msg;
  unsigned_long in_RSI;
  size_t *nn;
  Symbol *s;
  Exception *this_02;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  
  this_00 = std::
            stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
            ::top((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                   *)0x21878c);
  Symbol::kind(this_00);
  assertMatch(sTerminalLow,0x2187a7);
  Symbol::
  extrap<boost::tuples::tuple<unsigned_long,bool,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
            ((Symbol *)0x2187b1);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            boost::tuples::
            get<0,unsigned_long,boost::tuples::cons<bool,boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type>>>>
                      ((cons<unsigned_long,_boost::tuples::cons<bool,_boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type>_>_>_>
                        *)0x2187b9);
  if (*(unsigned_long *)this_01 != 0) {
    msg = (string *)__cxa_allocate_exception(0x18);
    this_02 = (Exception *)&stack0xffffffffffffffbf;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    Exception::Exception(this_02,msg);
    __cxa_throw(msg,&Exception::typeinfo,Exception::~Exception);
  }
  *(unsigned_long *)this_01 = in_RSI;
  return;
}

Assistant:

void setRepeatCount(size_t n) {
        Symbol& s = parsingStack.top();
        assertMatch(Symbol::sRepeater, s.kind());
        size_t& nn = boost::tuples::get<0>(*s.extrap<RepeaterInfo>());
        if (nn != 0) {
            throw Exception("Wrong number of items");
        }
        nn = n;
    }